

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::KeywordNameSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind - ArrayAndMethod < 2) || (kind - ArrayUniqueMethod < 2)) || (kind == ConstructorName)
       ) || ((kind == LocalScope || (kind == RootScope)))) ||
     ((kind == SuperHandle || ((kind == ThisHandle || (kind == UnitScope)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KeywordNameSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::ConstructorName:
        case SyntaxKind::LocalScope:
        case SyntaxKind::RootScope:
        case SyntaxKind::SuperHandle:
        case SyntaxKind::ThisHandle:
        case SyntaxKind::UnitScope:
            return true;
        default:
            return false;
    }
}